

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_tri_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  REF_INT RVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  REF_INT cell;
  REF_INT local [27];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    uVar14 = (ulong)uVar3;
    pcVar13 = "create";
    uVar7 = 0x169;
    goto LAB_0011d63e;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->twod = 1;
  iVar4 = ref_mpi->n;
  iVar5 = ref_mpi->id;
  iVar8 = 0;
  iVar10 = (int)(2 / (long)iVar4);
  iVar11 = iVar10 * iVar4;
  if (2 < iVar11) {
    iVar8 = ((((iVar4 + 2) / iVar4) * (iVar11 + -3)) / iVar10 - iVar11) + 3;
  }
  if (iVar5 == iVar8) {
LAB_0011d161:
    uVar3 = ref_node_add(ref_node,0,local);
    if (uVar3 != 0) {
      uVar14 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar7 = 0x179;
      goto LAB_0011d63e;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[0];
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar12 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar12) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar6 = ref_node->global[lVar12];
    }
    iVar4 = ref_mpi->n;
    iVar5 = (iVar4 + 2) / iVar4;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(2 % (long)iVar4) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar6 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar6 = ref_node->global[lVar12];
        }
      }
      iVar10 = (int)(2 / (long)iVar4);
      iVar4 = 3 - iVar4 * iVar10;
      RVar9 = iVar4 + (int)((lVar6 - iVar5 * iVar4) / (long)iVar10);
    }
    ref_node->part[lVar12] = RVar9;
    uVar3 = ref_node_add(ref_node,1,local + 1);
    if (uVar3 != 0) {
      uVar14 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar7 = 0x17a;
      goto LAB_0011d63e;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[1];
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar12 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar6 = -1;
    if (((-1 < lVar12) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar6 = ref_node->global[lVar12];
    }
    iVar4 = ref_mpi->n;
    iVar5 = (iVar4 + 2) / iVar4;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(2 % (long)iVar4) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar6 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar6 = ref_node->global[lVar12];
        }
      }
      iVar10 = (int)(2 / (long)iVar4);
      iVar4 = 3 - iVar4 * iVar10;
      RVar9 = iVar4 + (int)((lVar6 - iVar5 * iVar4) / (long)iVar10);
    }
    ref_node->part[lVar12] = RVar9;
    uVar3 = ref_node_add(ref_node,2,local + 2);
    if (uVar3 != 0) {
      uVar14 = (ulong)uVar3;
      pcVar13 = "add node";
      uVar7 = 0x17b;
      goto LAB_0011d63e;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[2];
    pRVar2[lVar12 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar12 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar12) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar6 = ref_node->global[lVar12];
    }
    iVar4 = ref_mpi->n;
    iVar5 = (iVar4 + 2) / iVar4;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(2 % (long)iVar4) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar6 = ref_node->global[lVar12];
        }
      }
      RVar9 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar6 = ref_node->global[lVar12];
        }
      }
      iVar10 = (int)(2 / (long)iVar4);
      iVar4 = 3 - iVar4 * iVar10;
      RVar9 = iVar4 + (int)((lVar6 - iVar5 * iVar4) / (long)iVar10);
    }
    ref_node->part[lVar12] = RVar9;
    local[3] = 0x65;
    uVar3 = ref_cell_add(pRVar1->cell[3],local,&cell);
    if (uVar3 != 0) {
      uVar14 = (ulong)uVar3;
      pcVar13 = "add tri";
      uVar7 = 0x17d;
      goto LAB_0011d63e;
    }
  }
  else {
    iVar4 = (iVar4 + 2) / iVar4;
    iVar8 = 0;
    if (iVar4 + 1U < 3) {
      iVar8 = iVar4;
    }
    iVar11 = 3 - iVar11;
    if (iVar11 <= iVar8) {
      iVar8 = (1 - iVar4 * iVar11) / iVar10 + iVar11;
    }
    if (iVar5 == iVar8) goto LAB_0011d161;
    iVar8 = (int)(2 / (long)iVar4);
    if (iVar11 <= iVar8) {
      iVar8 = (2 - iVar4 * iVar11) / iVar10 + iVar11;
    }
    if (iVar5 == iVar8) goto LAB_0011d161;
  }
  uVar3 = ref_node_initialize_n_global(ref_node,3);
  if (uVar3 == 0) {
    iVar4 = ref_mpi->n;
    iVar10 = 0;
    iVar5 = (int)(2 / (long)iVar4);
    iVar8 = iVar5 * iVar4;
    if (2 < iVar8) {
      iVar10 = ((((iVar4 + 2) / iVar4) * (iVar8 + -3)) / iVar5 - iVar8) + 3;
    }
    if (ref_mpi->id != iVar10) {
      iVar4 = (iVar4 + 2) / iVar4;
      iVar10 = 0;
      if (iVar4 + 1U < 3) {
        iVar10 = iVar4;
      }
      iVar8 = 3 - iVar8;
      if (iVar8 <= iVar10) {
        iVar10 = (1 - iVar4 * iVar8) / iVar5 + iVar8;
      }
      if (ref_mpi->id != iVar10) {
        return 0;
      }
    }
    uVar3 = ref_node_local(ref_node,0,local);
    if (uVar3 == 0) {
      uVar3 = ref_node_local(ref_node,1,local + 1);
      if (uVar3 == 0) {
        local[2] = 10;
        uVar3 = ref_cell_add(pRVar1->cell[0],local,&cell);
        if (uVar3 == 0) {
          return 0;
        }
        uVar14 = (ulong)uVar3;
        pcVar13 = "add edg";
        uVar7 = 0x18c;
      }
      else {
        uVar14 = (ulong)uVar3;
        pcVar13 = "loc";
        uVar7 = 0x18a;
      }
    }
    else {
      uVar14 = (ulong)uVar3;
      pcVar13 = "loc";
      uVar7 = 0x189;
    }
  }
  else {
    uVar14 = (ulong)uVar3;
    pcVar13 = "init glob";
    uVar7 = 0x180;
  }
LAB_0011d63e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar7,
         "ref_fixture_tri_grid",uVar14,pcVar13);
  return (REF_STATUS)uVar14;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnodesg = 3;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 101;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 0.0, 1.0, 0.0);
    add_that_node(2, 1.0, 0.0, 0.0);
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 1;
  global[2] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[2] = global[2];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}